

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O3

int write_wav_header(FILE *f,uint totalFrames)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  undefined4 local_1c;
  
  uVar2 = bit_depth;
  sVar3 = fwrite("RIFF",1,4,(FILE *)f);
  if (sVar3 == 4) {
    iVar1 = totalFrames * (uVar2 >> 3) * 2;
    local_1c = iVar1 + 0x3c;
    sVar3 = fwrite(&local_1c,1,4,(FILE *)f);
    if (sVar3 == 4) {
      sVar3 = fwrite("WAVE",1,4,(FILE *)f);
      if (sVar3 == 4) {
        sVar3 = fwrite("fmt ",1,4,(FILE *)f);
        if (sVar3 == 4) {
          local_1c = 0x28;
          sVar3 = fwrite(&local_1c,1,4,(FILE *)f);
          if (sVar3 == 4) {
            local_1c._0_2_ = 0xfffe;
            sVar3 = fwrite(&local_1c,1,2,(FILE *)f);
            if (sVar3 == 2) {
              local_1c = CONCAT22(local_1c._2_2_,2);
              sVar3 = fwrite(&local_1c,1,2,(FILE *)f);
              if (sVar3 == 2) {
                local_1c = sample_rate;
                sVar3 = fwrite(&local_1c,1,4,(FILE *)f);
                if (sVar3 == 4) {
                  local_1c = (bit_depth >> 3) * sample_rate * 2;
                  sVar3 = fwrite(&local_1c,1,4,(FILE *)f);
                  if (sVar3 == 4) {
                    local_1c = CONCAT31(local_1c._1_3_,(char)(bit_depth >> 2)) & 0xfffffffe;
                    local_1c._0_2_ = CONCAT11((char)(bit_depth >> 10),(undefined1)local_1c);
                    sVar3 = fwrite(&local_1c,1,2,(FILE *)f);
                    if (sVar3 == 2) {
                      local_1c._0_2_ = (undefined2)bit_depth;
                      sVar3 = fwrite(&local_1c,1,2,(FILE *)f);
                      if (sVar3 == 2) {
                        local_1c._0_2_ = 0x16;
                        sVar3 = fwrite(&local_1c,1,2,(FILE *)f);
                        if (sVar3 == 2) {
                          local_1c = CONCAT22(local_1c._2_2_,(short)bit_depth);
                          sVar3 = fwrite(&local_1c,1,2,(FILE *)f);
                          if (sVar3 == 2) {
                            local_1c = 3;
                            sVar3 = fwrite(&local_1c,1,4,(FILE *)f);
                            if (sVar3 == 4) {
                              local_1c = CONCAT22(local_1c._2_2_,1);
                              sVar3 = fwrite(&local_1c,1,2,(FILE *)f);
                              if (sVar3 == 2) {
                                sVar3 = fwrite("",1,0xe,(FILE *)f);
                                if (sVar3 == 0xe) {
                                  sVar3 = fwrite("data",1,4,(FILE *)f);
                                  if (sVar3 == 4) {
                                    local_1c = iVar1;
                                    sVar3 = fwrite(&local_1c,1,4,(FILE *)f);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (int)sVar3;
}

Assistant:

static int write_wav_header(FILE *f, unsigned int totalFrames) {
    unsigned int dataSize = totalFrames * (bit_depth / 8) * 2;
    UINT8 tmp[4];
    if(fwrite("RIFF",1,4,f) != 4) return 0;
    pack_uint32le(tmp, 4 + ( 8 + dataSize ) + (8 + 40) );
    if(fwrite(tmp,1,4,f) != 4) return 0;

    if(fwrite("WAVE",1,4,f) != 4) return 0;
    if(fwrite("fmt ",1,4,f) != 4) return 0;

    /* fmtSize
     * 16 = standard wave
     * 40 = extensible
     */
    pack_uint32le(tmp,40);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* audioFormat:
     * 1 = PCM
     * 3 = float
     * 6 = alaw
     * 7 = ulaw
     * 0xfffe = extensible */
    pack_uint16le(tmp,0xFFFE);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* numChannels */
    pack_uint16le(tmp,2);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* sampleRate */
    pack_uint32le(tmp,sample_rate);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* dataRate (bytes per second) */
    pack_uint32le(tmp,sample_rate * 2 * (bit_depth / 8));
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* block alignment (channels * sample size) */
    pack_uint16le(tmp,2 * (bit_depth / 8));
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* bits per sample */
    pack_uint16le(tmp,bit_depth);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* size of extended header */
    pack_uint16le(tmp,22);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* number of "valid" bits per sample? */
    pack_uint16le(tmp,bit_depth);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* speaker position mask */
    /* 3 = normal stereo */
    pack_uint32le(tmp,3);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    /* subformatcode - same as above audioFormat */
    pack_uint16le(tmp,1);
    if(fwrite(tmp,1,2,f) != 2) return 0;

    /* rest of the GUID */
    if(fwrite(extensible_guid_trailer,1,14,f) != 14) return 0;

    if(fwrite("data",1,4,f) != 4) return 0;

    pack_uint32le(tmp,dataSize);
    if(fwrite(tmp,1,4,f) != 4) return 0;

    return 1;
}